

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

basic_value<toml::discard_comments,_std::unordered_map,_std::vector> * __thiscall
toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::operator=
          (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *this,
          basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v)

{
  value_t vVar1;
  pointer pcVar2;
  integer iVar3;
  
  cleanup(this,(EVP_PKEY_CTX *)v);
  std::__shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->region_info_).
              super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>,
             &(v->region_info_).
              super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>);
  vVar1 = v->type_;
  this->type_ = vVar1;
  switch(vVar1) {
  case boolean:
    (this->field_1).boolean_ = (v->field_1).boolean_;
    break;
  case floating:
    (this->field_1).integer_ = (v->field_1).integer_;
    break;
  case string:
    string::string(&(this->field_1).string_,&(v->field_1).string_);
    break;
  case offset_datetime:
    pcVar2 = (v->field_1).string_.str._M_dataplus._M_p;
    (this->field_1).integer_ = (v->field_1).integer_;
    (this->field_1).string_.str._M_dataplus._M_p = pcVar2;
    break;
  case local_datetime:
    iVar3 = (v->field_1).integer_;
    *(undefined8 *)
     ((long)&(this->field_1).array_.ptr._M_t.
             super___uniq_ptr_impl<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::default_delete<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_*,_std::default_delete<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
             .
             super__Head_base<0UL,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_*,_false>
     + 6) = *(undefined8 *)
             ((long)&(v->field_1).array_.ptr._M_t.
                     super___uniq_ptr_impl<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::default_delete<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_*,_std::default_delete<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_*,_false>
             + 6);
LAB_00105354:
    (this->field_1).integer_ = iVar3;
    break;
  case local_date:
    (this->field_1).offset_datetime_.date = (v->field_1).offset_datetime_.date;
    break;
  case local_time:
    (this->field_1).local_time_.nanosecond = (v->field_1).local_time_.nanosecond;
  case integer:
    iVar3 = (v->field_1).integer_;
    goto LAB_00105354;
  case array:
  case table:
    (this->field_1).integer_ = (v->field_1).integer_;
    (v->field_1).integer_ = 0;
  }
  return this;
}

Assistant:

basic_value& operator=(basic_value&& v)
    {
        this->cleanup();
        this->region_info_ = std::move(v.region_info_);
        this->comments_ = std::move(v.comments_);
        this->type_ = v.type();
        switch(this->type_)
        {
            case value_t::boolean        : assigner(boolean_        , std::move(v.boolean_        )); break;
            case value_t::integer        : assigner(integer_        , std::move(v.integer_        )); break;
            case value_t::floating       : assigner(floating_       , std::move(v.floating_       )); break;
            case value_t::string         : assigner(string_         , std::move(v.string_         )); break;
            case value_t::offset_datetime: assigner(offset_datetime_, std::move(v.offset_datetime_)); break;
            case value_t::local_datetime : assigner(local_datetime_ , std::move(v.local_datetime_ )); break;
            case value_t::local_date     : assigner(local_date_     , std::move(v.local_date_     )); break;
            case value_t::local_time     : assigner(local_time_     , std::move(v.local_time_     )); break;
            case value_t::array          : assigner(array_          , std::move(v.array_          )); break;
            case value_t::table          : assigner(table_          , std::move(v.table_          )); break;
            default: break;
        }
        return *this;
    }